

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall re2::Regexp::ParseState::DoLeftParen(ParseState *this,StringPiece *name)

{
  bool bVar1;
  Regexp *this_00;
  char *pcVar2;
  StringPiece *this_01;
  int iVar3;
  Regexp *re;
  StringPiece *name_local;
  ParseState *this_local;
  
  this_00 = (Regexp *)operator_new(0x28);
  Regexp(this_00,kRegexpCharClass|kRegexpEmptyMatch,this->flags_);
  iVar3 = this->ncap_ + 1;
  this->ncap_ = iVar3;
  (this_00->field_7).field_0.max_ = iVar3;
  pcVar2 = StringPiece::data(name);
  if (pcVar2 != (char *)0x0) {
    this_01 = (StringPiece *)operator_new(0x20);
    StringPiece::as_string_abi_cxx11_(this_01);
    (this_00->field_7).field_1.name_ = (string *)this_01;
  }
  bVar1 = PushRegexp(this,this_00);
  return bVar1;
}

Assistant:

bool Regexp::ParseState::DoLeftParen(const StringPiece& name) {
  Regexp* re = new Regexp(kLeftParen, flags_);
  re->cap_ = ++ncap_;
  if (name.data() != NULL)
    re->name_ = new string(name.as_string());
  return PushRegexp(re);
}